

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FindInvalidDataProcess.cpp
# Opt level: O0

void __thiscall
Assimp::FindInvalidDataProcess::ProcessAnimationChannel
          (FindInvalidDataProcess *this,aiNodeAnim *anim)

{
  double dVar1;
  undefined8 uVar2;
  bool bVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  bool bVar8;
  aiQuatKey *paVar9;
  aiVectorKey *paVar10;
  Logger *this_00;
  aiVectorKey *local_d0;
  aiQuatKey *local_a8;
  aiVectorKey *local_80;
  aiVectorKey v_2;
  aiQuatKey v_1;
  aiVectorKey v;
  int i;
  aiNodeAnim *anim_local;
  FindInvalidDataProcess *this_local;
  
  if (anim == (aiNodeAnim *)0x0) {
    __assert_fail("nullptr != anim",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/PostProcessing/FindInvalidDataProcess.cpp"
                  ,0x11c,
                  "void Assimp::FindInvalidDataProcess::ProcessAnimationChannel(aiNodeAnim *)");
  }
  if (((anim->mNumPositionKeys == 0) && (anim->mNumRotationKeys == 0)) &&
     (anim->mNumScalingKeys == 0)) {
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/PostProcessing/FindInvalidDataProcess.cpp"
                  ,0x11e,
                  "void Assimp::FindInvalidDataProcess::ProcessAnimationChannel(aiNodeAnim *)");
  }
  bVar3 = false;
  if ((1 < anim->mNumPositionKeys) &&
     (bVar8 = AllIdentical<aiVectorKey>
                        (anim->mPositionKeys,anim->mNumPositionKeys,this->configEpsilon), bVar8)) {
    paVar10 = anim->mPositionKeys;
    dVar1 = paVar10->mTime;
    fVar4 = (paVar10->mValue).x;
    fVar5 = (paVar10->mValue).y;
    uVar2 = *(undefined8 *)&(paVar10->mValue).z;
    if (anim->mPositionKeys != (aiVectorKey *)0x0) {
      operator_delete__(anim->mPositionKeys);
    }
    anim->mNumPositionKeys = 1;
    paVar10 = (aiVectorKey *)operator_new__(0x18);
    local_80 = paVar10;
    do {
      aiVectorKey::aiVectorKey(local_80);
      local_80 = local_80 + 1;
    } while (local_80 != paVar10 + 1);
    anim->mPositionKeys = paVar10;
    paVar10 = anim->mPositionKeys;
    paVar10->mTime = dVar1;
    (paVar10->mValue).x = fVar4;
    (paVar10->mValue).y = fVar5;
    v.mValue.x = (float)uVar2;
    (paVar10->mValue).z = v.mValue.x;
    bVar3 = true;
  }
  if ((1 < anim->mNumRotationKeys) &&
     (bVar8 = AllIdentical<aiQuatKey>
                        (anim->mRotationKeys,anim->mNumRotationKeys,this->configEpsilon), bVar8)) {
    paVar9 = anim->mRotationKeys;
    dVar1 = paVar9->mTime;
    fVar4 = (paVar9->mValue).w;
    fVar5 = (paVar9->mValue).x;
    fVar6 = (paVar9->mValue).y;
    fVar7 = (paVar9->mValue).z;
    if (anim->mRotationKeys != (aiQuatKey *)0x0) {
      operator_delete__(anim->mRotationKeys);
    }
    anim->mNumRotationKeys = 1;
    paVar9 = (aiQuatKey *)operator_new__(0x18);
    local_a8 = paVar9;
    do {
      aiQuatKey::aiQuatKey(local_a8);
      local_a8 = local_a8 + 1;
    } while (local_a8 != paVar9 + 1);
    anim->mRotationKeys = paVar9;
    paVar9 = anim->mRotationKeys;
    paVar9->mTime = dVar1;
    (paVar9->mValue).w = fVar4;
    (paVar9->mValue).x = fVar5;
    (paVar9->mValue).y = fVar6;
    (paVar9->mValue).z = fVar7;
    bVar3 = true;
  }
  if ((1 < anim->mNumScalingKeys) &&
     (bVar8 = AllIdentical<aiVectorKey>
                        (anim->mScalingKeys,anim->mNumScalingKeys,this->configEpsilon), bVar8)) {
    paVar10 = anim->mScalingKeys;
    dVar1 = paVar10->mTime;
    fVar4 = (paVar10->mValue).x;
    fVar5 = (paVar10->mValue).y;
    uVar2 = *(undefined8 *)&(paVar10->mValue).z;
    if (anim->mScalingKeys != (aiVectorKey *)0x0) {
      operator_delete__(anim->mScalingKeys);
    }
    anim->mNumScalingKeys = 1;
    paVar10 = (aiVectorKey *)operator_new__(0x18);
    local_d0 = paVar10;
    do {
      aiVectorKey::aiVectorKey(local_d0);
      local_d0 = local_d0 + 1;
    } while (local_d0 != paVar10 + 1);
    anim->mScalingKeys = paVar10;
    paVar10 = anim->mScalingKeys;
    paVar10->mTime = dVar1;
    (paVar10->mValue).x = fVar4;
    (paVar10->mValue).y = fVar5;
    v_2.mValue.x = (float)uVar2;
    (paVar10->mValue).z = v_2.mValue.x;
    bVar3 = true;
  }
  if (bVar3) {
    this_00 = DefaultLogger::get();
    Logger::warn(this_00,"Simplified dummy tracks with just one key");
  }
  return;
}

Assistant:

void FindInvalidDataProcess::ProcessAnimationChannel (aiNodeAnim* anim) {
    ai_assert( nullptr != anim );
    if (anim->mNumPositionKeys == 0 && anim->mNumRotationKeys == 0 && anim->mNumScalingKeys == 0) {
        ai_assert_entry();
        return;
    }

    // Check whether all values in a tracks are identical - in this case
    // we can remove al keys except one.
    // POSITIONS
    int i = 0;
    if (anim->mNumPositionKeys > 1 && AllIdentical(anim->mPositionKeys,anim->mNumPositionKeys,configEpsilon)) {
        aiVectorKey v = anim->mPositionKeys[0];

        // Reallocate ... we need just ONE element, it makes no sense to reuse the array
        delete[] anim->mPositionKeys;
        anim->mPositionKeys = new aiVectorKey[anim->mNumPositionKeys = 1];
        anim->mPositionKeys[0] = v;
        i = 1;
    }

    // ROTATIONS
    if (anim->mNumRotationKeys > 1 && AllIdentical(anim->mRotationKeys,anim->mNumRotationKeys,configEpsilon)) {
        aiQuatKey v = anim->mRotationKeys[0];

        // Reallocate ... we need just ONE element, it makes no sense to reuse the array
        delete[] anim->mRotationKeys;
        anim->mRotationKeys = new aiQuatKey[anim->mNumRotationKeys = 1];
        anim->mRotationKeys[0] = v;
        i = 1;
    }

    // SCALINGS
    if (anim->mNumScalingKeys > 1 && AllIdentical(anim->mScalingKeys,anim->mNumScalingKeys,configEpsilon)) {
        aiVectorKey v = anim->mScalingKeys[0];

        // Reallocate ... we need just ONE element, it makes no sense to reuse the array
        delete[] anim->mScalingKeys;
        anim->mScalingKeys = new aiVectorKey[anim->mNumScalingKeys = 1];
        anim->mScalingKeys[0] = v;
        i = 1;
    }
    if ( 1 == i ) {
        ASSIMP_LOG_WARN("Simplified dummy tracks with just one key");
    }
}